

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O2

void muladd(uECC_word_t a,uECC_word_t b,uECC_word_t *r0,uECC_word_t *r1,uECC_word_t *r2)

{
  uECC_word_t uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  ulong uVar7;
  
  auVar4._8_8_ = 0;
  auVar4._0_8_ = b;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = a;
  uVar7 = SUB168(auVar4 * auVar5,8);
  uVar6 = SUB168(auVar4 * auVar5,0);
  uVar1 = *r0;
  uVar2 = (ulong)CARRY8(uVar6,*r0);
  uVar3 = uVar7 + *r1;
  *r2 = *r2 + (ulong)(CARRY8(uVar7,*r1) || CARRY8(uVar3,uVar2));
  *r1 = uVar3 + uVar2;
  *r0 = uVar6 + uVar1;
  return;
}

Assistant:

static void muladd(uECC_word_t a,
                   uECC_word_t b,
                   uECC_word_t *r0,
                   uECC_word_t *r1,
                   uECC_word_t *r2) {
#if uECC_WORD_SIZE == 8 && !SUPPORTS_INT128
    uint64_t a0 = a & 0xffffffffull;
    uint64_t a1 = a >> 32;
    uint64_t b0 = b & 0xffffffffull;
    uint64_t b1 = b >> 32;

    uint64_t i0 = a0 * b0;
    uint64_t i1 = a0 * b1;
    uint64_t i2 = a1 * b0;
    uint64_t i3 = a1 * b1;

    uint64_t p0, p1;

    i2 += (i0 >> 32);
    i2 += i1;
    if (i2 < i1) { /* overflow */
        i3 += 0x100000000ull;
    }

    p0 = (i0 & 0xffffffffull) | (i2 << 32);
    p1 = i3 + (i2 >> 32);

    *r0 += p0;
    *r1 += (p1 + (*r0 < p0));
    *r2 += ((*r1 < p1) || (*r1 == p1 && *r0 < p0));
#else
    uECC_dword_t p = (uECC_dword_t)a * b;
    uECC_dword_t r01 = ((uECC_dword_t)(*r1) << uECC_WORD_BITS) | *r0;
    r01 += p;
    *r2 += (r01 < p);
    *r1 = r01 >> uECC_WORD_BITS;
    *r0 = (uECC_word_t)r01;
#endif
}